

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall
llbuild::core::BuildEngine::removeCancellationDelegate(BuildEngine *this,CancellationDelegate *del)

{
  pthread_mutex_t *__mutex;
  void *pvVar1;
  CancellationDelegate *local_20;
  
  pvVar1 = this->impl;
  __mutex = (pthread_mutex_t *)((long)pvVar1 + 0x90);
  local_20 = del;
  std::mutex::lock((mutex *)&__mutex->__data);
  llvm::
  DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
  ::erase((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
           *)((long)pvVar1 + 0xf8),&local_20);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void BuildEngine::removeCancellationDelegate(CancellationDelegate* del) {
  static_cast<BuildEngineImpl*>(impl)->removeCancellationDelegate(del);
}